

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_sad_avx2.c
# Opt level: O1

uint aom_highbd_sad32x8_avg_avx2
               (uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,uint8_t *second_pred)

{
  undefined1 auVar1 [16];
  long lVar2;
  uint16_t *src_ptr;
  uint16_t *ref_ptr;
  undefined1 auVar3 [32];
  __m256i sad;
  __m256i local_80 [2];
  
  local_80[0] = (__m256i)ZEXT1632(ZEXT816(0) << 0x40);
  src_ptr = (uint16_t *)((long)src * 2);
  ref_ptr = (uint16_t *)((long)ref * 2);
  lVar2 = 0;
  do {
    sad32x4(src_ptr,src_stride,ref_ptr,ref_stride,(uint16_t *)((long)second_pred * 2 + lVar2),
            local_80);
    lVar2 = lVar2 + 0x100;
    src_ptr = src_ptr + src_stride * 4;
    ref_ptr = ref_ptr + ref_stride * 4;
  } while ((int)lVar2 == 0x100);
  auVar3 = vpsrldq_avx2((undefined1  [32])local_80[0],8);
  auVar3 = vpaddd_avx2(auVar3,(undefined1  [32])local_80[0]);
  auVar1 = vpaddd_avx(auVar3._16_16_,auVar3._0_16_);
  auVar1 = vphaddd_avx(auVar1,auVar1);
  return auVar1._0_4_;
}

Assistant:

unsigned int aom_highbd_sad32x8_avg_avx2(const uint8_t *src, int src_stride,
                                         const uint8_t *ref, int ref_stride,
                                         const uint8_t *second_pred) {
  __m256i sad = _mm256_setzero_si256();
  uint16_t *srcp = CONVERT_TO_SHORTPTR(src);
  uint16_t *refp = CONVERT_TO_SHORTPTR(ref);
  uint16_t *secp = CONVERT_TO_SHORTPTR(second_pred);
  const int left_shift = 2;
  int row_section = 0;

  while (row_section < 2) {
    sad32x4(srcp, src_stride, refp, ref_stride, secp, &sad);
    srcp += src_stride << left_shift;
    refp += ref_stride << left_shift;
    secp += 32 << left_shift;
    row_section += 1;
  }
  return get_sad_from_mm256_epi32(&sad);
}